

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate_tz.cpp
# Opt level: O2

QMap<int,_QByteArray> parseTzAbbreviations(QDataStream *ds,int tzh_charcnt,QList<QTzType> *types)

{
  long lVar1;
  Status SVar2;
  QByteArray *this;
  long in_RCX;
  int iVar3;
  ulong uVar4;
  undefined4 in_register_00000034;
  QDataStream *this_00;
  long lVar5;
  long in_FS_OFFSET;
  quint8 ch;
  uint local_7c;
  QArrayDataPointer<char> local_78;
  QArrayDataPointer<char> local_58;
  qint8 local_39;
  long local_38;
  
  this_00 = (QDataStream *)CONCAT44(in_register_00000034,tzh_charcnt);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  ds->d = (void *)0x0;
  local_39 = -0x56;
  local_58.d = (Data *)0x0;
  local_58.ptr = (char *)0x0;
  local_58.size = 0;
  uVar4 = 0;
  if (0 < (int)types) {
    uVar4 = (ulong)types & 0xffffffff;
  }
  while (iVar3 = (int)uVar4, uVar4 = (ulong)(iVar3 - 1), iVar3 != 0) {
    SVar2 = QDataStream::status(this_00);
    if (SVar2 != Ok) break;
    QDataStream::operator>>(this_00,&local_39);
    SVar2 = QDataStream::status(this_00);
    if (SVar2 != Ok) goto LAB_003b25c3;
    QByteArray::append((QByteArray *)&local_58,local_39);
  }
  lVar5 = *(long *)(in_RCX + 8);
  lVar1 = lVar5 + *(long *)(in_RCX + 0x10) * 8;
  for (; lVar5 != lVar1; lVar5 = lVar5 + 8) {
    local_78.d = (Data *)0x0;
    local_78.ptr = (char *)0x0;
    local_78.size = 0;
    for (uVar4 = (ulong)*(byte *)(lVar5 + 5); local_58.ptr[uVar4] != '\0'; uVar4 = uVar4 + 1) {
      QByteArray::append((QByteArray *)&local_78,local_58.ptr[uVar4]);
    }
    local_7c = (uint)*(byte *)(lVar5 + 5);
    this = QMap<int,_QByteArray>::operator[]((QMap<int,_QByteArray> *)ds,(int *)&local_7c);
    QByteArray::operator=(this,(QByteArray *)&local_78);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_78);
  }
LAB_003b25c3:
  QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>_>
            )(QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>_>
              )ds;
  }
  __stack_chk_fail();
}

Assistant:

static QMap<int, QByteArray> parseTzAbbreviations(QDataStream &ds, int tzh_charcnt, const QList<QTzType> &types)
{
    // Parse the abbreviation list which is tzh_charcnt long with '\0' separated strings. The
    // QTzType.tz_abbrind index points to the first char of the abbreviation in the array, not the
    // occurrence in the list. It can also point to a partial string so we need to use the actual typeList
    // index values when parsing.  By using a map with tz_abbrind as ordered key we get both index
    // methods in one data structure and can convert the types afterwards.
    QMap<int, QByteArray> map;
    quint8 ch;
    QByteArray input;
    // First parse the full abbrev string
    for (int i = 0; i < tzh_charcnt && ds.status() == QDataStream::Ok; ++i) {
        ds >> ch;
        if (ds.status() == QDataStream::Ok)
            input.append(char(ch));
        else
            return map;
    }
    // Then extract all the substrings pointed to by types
    for (const QTzType &type : types) {
        QByteArray abbrev;
        for (int i = type.tz_abbrind; input.at(i) != '\0'; ++i)
            abbrev.append(input.at(i));
        // Have reached end of an abbreviation, so add to map
        map[type.tz_abbrind] = abbrev;
    }
    return map;
}